

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O2

SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> * __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
::SweepPendingObjects<(Memory::SweepMode)1>
          (SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           *this,Recycler *recycler,
          SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *list)

{
  anon_class_24_3_33b0e536 fn;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *local_30;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *tail;
  Recycler *pRStack_20;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> **local_18;
  
  local_18 = &local_30;
  local_30 = (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  fn.recycler = recycler;
  fn.this = this;
  fn.tail = local_18;
  tail = (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)this;
  pRStack_20 = recycler;
  HeapBlockList::
  ForEachEditing<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::SweepPendingObjects<(Memory::SweepMode)1>(Memory::Recycler*,Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (list,(SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0,fn);
  return local_30;
}

Assistant:

TBlockType *
SmallNormalHeapBucketBase<TBlockType>::SweepPendingObjects(Recycler * recycler, TBlockType * list)
{
    TBlockType * tail = nullptr;
    HeapBlockList::ForEachEditing(list, [this, recycler, &tail](TBlockType * heapBlock)
    {
        // Note, page heap blocks are never swept concurrently
#ifdef RECYCLER_TRACE
        recycler->PrintBlockStatus(this, heapBlock, _u("[**18**] calling SweepObjects."));
#endif
        heapBlock->template SweepObjects<mode>(recycler);
        tail = heapBlock;

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
        if (this->AllocationsStartedDuringConcurrentSweep())
        {
            Assert(!this->IsAnyFinalizableBucket());
            DebugOnly(this->AssertCheckHeapBlockNotInAnyList(heapBlock));
            // If we exhausted the free list during this sweep, we will need to send this block to the FullBlockList.
            if (heapBlock->HasFreeObject())
            {
                Assert(!heapBlock->isPendingConcurrentSweepPrep);
                bool blockAddedToSList = HeapBucketT<TBlockType>::PushHeapBlockToSList(this->allocableHeapBlockListHead, heapBlock);

                // If we encountered OOM while pushing the heapBlock to the SLIST we must add it to the heapBlockList so we don't lose track of it.
                if (!blockAddedToSList)
                {
                    //TODO: akatti: We should handle this gracefully and try to recover from this state.
                    AssertOrFailFastMsg(false, "OOM while adding a heap block to the SLIST during concurrent sweep.");
                }
#ifdef RECYCLER_TRACE
                else
                {
                    recycler->PrintBlockStatus(this, heapBlock, _u("[**24**] finished SweepPendingObjects, heapblock added to SLIST allocableHeapBlockListHead."));
                }
#endif
            }
            else
            {
                DebugOnly(this->AssertCheckHeapBlockNotInAnyList(heapBlock));
                heapBlock->SetNextBlock(this->fullBlockList);
                this->fullBlockList = heapBlock;
#ifdef RECYCLER_TRACE
                recycler->PrintBlockStatus(this, heapBlock, _u("[**25**] finished SweepPendingObjects, heapblock added to fullBlockList."));
#endif
            }
        }
#endif
    });
    return tail;
}